

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlChar * xmlParseEncName(xmlParserCtxtPtr ctxt)

{
  byte bVar1;
  int max;
  byte *pbVar2;
  bool bVar3;
  int newSize;
  xmlChar *tmp;
  int iStack_28;
  xmlChar cur;
  int maxLength;
  int size;
  int len;
  xmlChar *buf;
  xmlParserCtxtPtr ctxt_local;
  
  _size = (byte *)0x0;
  iStack_28 = 10;
  max = 50000;
  if ((ctxt->options & 0x80000U) != 0) {
    max = 10000000;
  }
  bVar1 = *ctxt->input->cur;
  if (((bVar1 < 0x61) || (0x7a < bVar1)) && ((bVar1 < 0x41 || (0x5a < bVar1)))) {
    xmlFatalErr(ctxt,XML_ERR_ENCODING_NAME,(char *)0x0);
  }
  else {
    _size = (byte *)(*xmlMalloc)(10);
    if (_size == (byte *)0x0) {
      xmlErrMemory(ctxt);
      return (xmlChar *)0x0;
    }
    *_size = bVar1;
    xmlNextChar(ctxt);
    tmp._3_1_ = *ctxt->input->cur;
    maxLength = 1;
    while( true ) {
      if ((((tmp._3_1_ < 0x61) || (bVar3 = true, 0x7a < tmp._3_1_)) &&
          ((tmp._3_1_ < 0x41 || (bVar3 = true, 0x5a < tmp._3_1_)))) &&
         ((((tmp._3_1_ < 0x30 || (bVar3 = true, 0x39 < tmp._3_1_)) &&
           (bVar3 = true, tmp._3_1_ != 0x2e)) && (bVar3 = true, tmp._3_1_ != 0x5f)))) {
        bVar3 = tmp._3_1_ == 0x2d;
      }
      if (!bVar3) break;
      pbVar2 = _size;
      if (iStack_28 <= maxLength + 1) {
        iStack_28 = xmlGrowCapacity(iStack_28,1,1,max);
        if (iStack_28 < 0) {
          xmlFatalErr(ctxt,XML_ERR_NAME_TOO_LONG,"EncName");
          (*xmlFree)(_size);
          return (xmlChar *)0x0;
        }
        pbVar2 = (byte *)(*xmlRealloc)(_size,(long)iStack_28);
        if (pbVar2 == (byte *)0x0) {
          xmlErrMemory(ctxt);
          (*xmlFree)(_size);
          return (xmlChar *)0x0;
        }
      }
      _size = pbVar2;
      _size[maxLength] = tmp._3_1_;
      xmlNextChar(ctxt);
      tmp._3_1_ = *ctxt->input->cur;
      maxLength = maxLength + 1;
    }
    _size[maxLength] = 0;
  }
  return _size;
}

Assistant:

xmlChar *
xmlParseEncName(xmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    int len = 0;
    int size = 10;
    int maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                    XML_MAX_TEXT_LENGTH :
                    XML_MAX_NAME_LENGTH;
    xmlChar cur;

    cur = CUR;
    if (((cur >= 'a') && (cur <= 'z')) ||
        ((cur >= 'A') && (cur <= 'Z'))) {
	buf = xmlMalloc(size);
	if (buf == NULL) {
	    xmlErrMemory(ctxt);
	    return(NULL);
	}

	buf[len++] = cur;
	NEXT;
	cur = CUR;
	while (((cur >= 'a') && (cur <= 'z')) ||
	       ((cur >= 'A') && (cur <= 'Z')) ||
	       ((cur >= '0') && (cur <= '9')) ||
	       (cur == '.') || (cur == '_') ||
	       (cur == '-')) {
	    if (len + 1 >= size) {
	        xmlChar *tmp;
                int newSize;

                newSize = xmlGrowCapacity(size, 1, 1, maxLength);
                if (newSize < 0) {
                    xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "EncName");
                    xmlFree(buf);
                    return(NULL);
                }
		tmp = xmlRealloc(buf, newSize);
		if (tmp == NULL) {
		    xmlErrMemory(ctxt);
		    xmlFree(buf);
		    return(NULL);
		}
		buf = tmp;
                size = newSize;
	    }
	    buf[len++] = cur;
	    NEXT;
	    cur = CUR;
        }
	buf[len] = 0;
    } else {
	xmlFatalErr(ctxt, XML_ERR_ENCODING_NAME, NULL);
    }
    return(buf);
}